

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::
strTree<char_const*&,char_const(&)[2],kj::StringTree,char_const(&)[2],kj::String&,char_const(&)[2],char_const*&>
          (StringTree *__return_storage_ptr__,kj *this,char **params,char (*params_1) [2],
          StringTree *params_2,char (*params_3) [2],String *params_4,char (*params_5) [2],
          char **params_6)

{
  char **ppcVar1;
  char (*pacVar2) [2];
  StringTree *pSVar3;
  String *value;
  ArrayPtr<const_char> *in_stack_ffffffffffffff48;
  ArrayPtr<const_char> local_98;
  ArrayPtr<const_char> local_88;
  ArrayPtr<const_char> local_78;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  ArrayDisposer *local_38;
  String *params_local_4;
  char (*params_local_3) [2];
  StringTree *params_local_2;
  char (*params_local_1) [2];
  char **params_local;
  
  local_38 = (ArrayDisposer *)params_3;
  params_local_4 = (String *)params_2;
  params_local_3 = params_1;
  params_local_2 = (StringTree *)params;
  params_local_1 = (char (*) [2])this;
  params_local = (char **)__return_storage_ptr__;
  ppcVar1 = fwd<char_const*&>((char **)this);
  local_48 = _::toStringTreeOrCharSequence<char_const*&>(ppcVar1);
  pacVar2 = ::const((char (*) [2])params_local_2);
  local_58 = _::toStringTreeOrCharSequence<char_const(&)[2]>(pacVar2);
  pSVar3 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_local_3);
  pSVar3 = _::toStringTreeOrCharSequence(pSVar3);
  pacVar2 = ::const((char (*) [2])params_local_4);
  local_68 = _::toStringTreeOrCharSequence<char_const(&)[2]>(pacVar2);
  value = fwd<kj::String&>((String *)local_38);
  local_78 = _::toStringTreeOrCharSequence<kj::String&>(value);
  pacVar2 = ::const((char (*) [2])params_4);
  local_88 = _::toStringTreeOrCharSequence<char_const(&)[2]>(pacVar2);
  ppcVar1 = fwd<char_const*&>((char **)params_5);
  local_98 = _::toStringTreeOrCharSequence<char_const*&>(ppcVar1);
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_48,&local_58,(ArrayPtr<const_char> *)pSVar3
             ,(StringTree *)&local_68,&local_78,&local_88,&local_98,in_stack_ffffffffffffff48);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}